

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void SetNewArrayElements(ParseNode *pnode,RegSlot arrayLocation,ByteCodeGenerator *byteCodeGenerator
                        ,FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  uint argCount;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar1;
  OpCode OVar2;
  bool bVar3;
  RegSlot RVar4;
  BOOL BVar5;
  RegSlot RVar6;
  ParseNodeUni *pPVar7;
  ParseNodeArrLit *pPVar8;
  undefined4 *puVar9;
  AuxArray<int> *obj;
  AuxArray<void_*> *obj_00;
  ParseNodeBin *pPVar10;
  ulong uVar11;
  AuxArray<double> *obj_01;
  OpCode op;
  FuncInfo *pFVar12;
  size_t sVar13;
  char *pcVar14;
  int iVar15;
  int byteCount;
  ParseNode *args;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  AuxArray<unsigned_int> *local_78;
  uint local_64;
  int32 local_54;
  FuncInfo *pFStack_50;
  int auxSize;
  ByteCodeGenerator *local_48;
  int32 local_3c;
  RegSlot local_38;
  int extraAlloc;
  
  pPVar7 = ParseNode::AsParseNodeUni(pnode);
  args = pPVar7->pnode1;
  pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
  argCount = pPVar8->count;
  pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
  uVar16 = pPVar8->spreadCount;
  pFStack_50 = funcInfo;
  bVar3 = CreateNativeArrays(byteCodeGenerator,funcInfo);
  local_48 = byteCodeGenerator;
  if (bVar3) {
    pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
    if ((pPVar8->field_0x20 & 2) != 0) {
      local_3c = 0;
      local_54 = 0;
      bVar3 = Int32Math::Mul(argCount,4,&local_3c);
      if ((bVar3) || (bVar3 = Int32Math::Add(4,local_3c,&local_54), bVar3)) goto LAB_00820b2e;
      pcVar14 = (char *)byteCodeGenerator->alloc;
      uVar17 = (ulong)local_3c;
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00820b33;
        *puVar9 = 0;
        byteCodeGenerator = local_48;
      }
      sVar13 = 0xffffffffffffffff;
      if (uVar17 < 0xfffffffffffffffc) {
        sVar13 = uVar17 + 4;
      }
      obj = (AuxArray<int> *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pcVar14,sVar13);
      if (obj == (AuxArray<int> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        pcVar14 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
        ;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x20d,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00820b33;
        *puVar9 = 0;
        byteCodeGenerator = local_48;
      }
      obj->count = argCount;
      EmitConstantArgsToIntArray((ByteCodeGenerator *)pcVar14,(int32 *)(obj + 1),args,argCount);
      pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
      if ((pPVar8->field_0x20 & 8) == 0) {
LAB_00820419:
        Js::ByteCodeWriter::Auxiliary
                  (&byteCodeGenerator->m_writer,NewScIntArray,pnode->location,obj,local_54,argCount)
        ;
        Memory::
        DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<int>>
                  (byteCodeGenerator->alloc,obj,(long)local_3c);
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x23a6,"(!pnode->AsParseNodeArrLit()->hasMissingValues)",
                         "!pnode->AsParseNodeArrLit()->hasMissingValues");
      if (bVar3) {
        *puVar9 = 0;
        byteCodeGenerator = local_48;
        goto LAB_00820419;
      }
      goto LAB_00820b33;
    }
    if ((bVar3) && (pPVar8 = ParseNode::AsParseNodeArrLit(pnode), (pPVar8->field_0x20 & 4) != 0)) {
      local_3c = 0;
      local_54 = 0;
      bVar3 = Int32Math::Mul(argCount,8,&local_3c);
      if ((!bVar3) && (bVar3 = Int32Math::Add(8,local_3c,&local_54), !bVar3)) {
        pcVar14 = (char *)byteCodeGenerator->alloc;
        uVar17 = (ulong)local_3c;
        BVar5 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar3) goto LAB_00820b33;
          *puVar9 = 0;
          byteCodeGenerator = local_48;
        }
        sVar13 = 0xffffffffffffffff;
        if (uVar17 < 0xfffffffffffffff8) {
          sVar13 = uVar17 + 8;
        }
        obj_01 = (AuxArray<double> *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pcVar14,sVar13);
        if (obj_01 == (AuxArray<double> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          pcVar14 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
          ;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x20d,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar3) goto LAB_00820b33;
          *puVar9 = 0;
          byteCodeGenerator = local_48;
        }
        obj_01->count = argCount;
        EmitConstantArgsToFltArray
                  ((ByteCodeGenerator *)pcVar14,(double *)(obj_01 + 1),args,argCount);
        pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
        if ((pPVar8->field_0x20 & 8) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x23bc,"(!pnode->AsParseNodeArrLit()->hasMissingValues)",
                             "!pnode->AsParseNodeArrLit()->hasMissingValues");
          if (!bVar3) goto LAB_00820b33;
          *puVar9 = 0;
          byteCodeGenerator = local_48;
        }
        Js::ByteCodeWriter::Auxiliary
                  (&byteCodeGenerator->m_writer,NewScFltArray,pnode->location,obj_01,local_54,
                   argCount);
        Memory::
        DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<double>>
                  (byteCodeGenerator->alloc,obj_01,(long)local_3c);
        return;
      }
      goto LAB_00820b2e;
    }
  }
  pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
  if ((pPVar8->field_0x20 & 1) == 0) {
    bVar18 = false;
  }
  else {
    pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
    bVar18 = 1 < pPVar8->count;
  }
  if ((bVar3 & bVar18) == 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x23c8,"(!arrayLitOpt || !nativeArrays)","!arrayLitOpt || !nativeArrays");
    if (!bVar3) goto LAB_00820b33;
    *puVar9 = 0;
  }
  if (0x3fffffff < uVar16) goto LAB_00820b2e;
  uVar17 = (ulong)uVar16 * 4;
  pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
  if (pPVar8->spreadCount == 0) {
    local_78 = (AuxArray<unsigned_int> *)0x0;
    RVar4 = arrayLocation;
  }
  else {
    RVar4 = FuncInfo::AcquireTmpRegister(pFStack_50);
    this_00 = &byteCodeGenerator->alloc->
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00820b33;
      *puVar9 = 0;
      byteCodeGenerator = local_48;
    }
    local_78 = (AuxArray<unsigned_int> *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(this_00,uVar17 + 4);
    if (local_78 == (AuxArray<unsigned_int> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00820b33;
      *puVar9 = 0;
    }
    local_78->count = uVar16;
  }
  pFVar12 = pFStack_50;
  this = &byteCodeGenerator->m_writer;
  pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
  extraAlloc = RVar4;
  Js::ByteCodeWriter::Reg1Unsigned1
            (this,(ushort)((pPVar8->field_0x20 & 8) >> 3) * 2 + NewScArray,RVar4,argCount);
  if (args != (ParseNode *)0x0) {
    if (argCount == 1) {
      bVar3 = Js::ByteCodeWriter::DoProfileNewScArrayOp(this,NewScArray);
      op = StArrItemC_CI4;
      local_38 = extraAlloc;
      if (bVar3) goto LAB_00820242;
    }
    else {
LAB_00820242:
      OVar2 = StArrSegItem_A;
      if (bVar18 == false) {
        bVar3 = Js::JavascriptArray::HasInlineHeadSegment(argCount);
        op = StArrInlineItem_CI4;
        local_38 = extraAlloc;
        if (!bVar3) {
          op = StArrItemI_CI4;
          OVar2 = StArrSegItem_CI4;
          if (argCount < 0x40001) goto LAB_00820250;
        }
      }
      else {
LAB_00820250:
        op = OVar2;
        local_38 = FuncInfo::AcquireTmpRegister(pFStack_50);
        Js::ByteCodeWriter::Reg2(this,LdArrHead,local_38,extraAlloc);
      }
    }
    if (bVar18 == false) {
      uVar16 = 0;
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      local_64 = 0;
      pFVar12 = pFStack_50;
      byteCodeGenerator = local_48;
      while (args->nop == knopList) {
        pPVar10 = ParseNode::AsParseNodeBin(args);
        if (pPVar10->pnode1->nop != knopEmpty) {
          pPVar10 = ParseNode::AsParseNodeBin(args);
          Emit(pPVar10->pnode1,byteCodeGenerator,pFVar12,0,false,false);
          pPVar10 = ParseNode::AsParseNodeBin(args);
          RVar4 = pPVar10->pnode1->location;
          pPVar10 = ParseNode::AsParseNodeBin(args);
          RVar6 = RVar4;
          if (pPVar10->pnode1->nop == knopEllipsis) {
            if (local_78 == (AuxArray<unsigned_int> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x2414,"(spreadIndices)","spreadIndices");
              if (!bVar3) goto LAB_00820b33;
              *puVar9 = 0;
            }
            RVar6 = FuncInfo::AcquireTmpRegister(pFStack_50);
            Js::ByteCodeWriter::Reg2(this,LdCustomSpreadIteratorList,RVar6,RVar4);
            uVar11 = (ulong)local_64;
            local_64 = local_64 + 1;
            local_78[uVar11 + 1].count = uVar16;
            byteCodeGenerator = local_48;
          }
          Js::ByteCodeWriter::ElementUnsigned1(this,op,RVar6,local_38,uVar16);
          pPVar10 = ParseNode::AsParseNodeBin(args);
          if (pPVar10->pnode1->nop == knopEllipsis) {
            FuncInfo::ReleaseTmpRegister(pFStack_50,RVar6);
          }
          pPVar10 = ParseNode::AsParseNodeBin(args);
          pFVar12 = pFStack_50;
          FuncInfo::ReleaseLoc(pFStack_50,pPVar10->pnode1);
        }
        pPVar10 = ParseNode::AsParseNodeBin(args);
        uVar16 = uVar16 + 1;
        args = pPVar10->pnode2;
      }
      RVar4 = extraAlloc;
      if (args->nop != knopEmpty) {
        Emit(args,byteCodeGenerator,pFVar12,0,false,false);
        RVar4 = args->location;
        RVar6 = RVar4;
        if (args->nop == knopEllipsis) {
          RVar6 = FuncInfo::AcquireTmpRegister(pFVar12);
          Js::ByteCodeWriter::Reg2(this,LdCustomSpreadIteratorList,RVar6,RVar4);
          if (local_78 == (AuxArray<unsigned_int> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar9 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x2431,"(spreadIndices)","spreadIndices");
            if (!bVar3) goto LAB_00820b33;
            *puVar9 = 0;
          }
          local_78[(ulong)local_64 + 1].count = uVar16;
        }
        Js::ByteCodeWriter::ElementUnsigned1(this,op,RVar6,local_38,uVar16);
        RVar4 = extraAlloc;
        if (args->nop == knopEllipsis) {
          FuncInfo::ReleaseTmpRegister(pFStack_50,RVar6);
        }
        FuncInfo::ReleaseLoc(pFStack_50,args);
        uVar16 = uVar16 + 1;
        byteCodeGenerator = local_48;
      }
      RVar6 = local_38;
      pFVar12 = pFStack_50;
      if (argCount < uVar16) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x243f,"(i <= argCount)","i <= argCount");
        if (!bVar3) {
LAB_00820b33:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar9 = 0;
        byteCodeGenerator = local_48;
      }
    }
    else {
      if (0x1fffffff < argCount) goto LAB_00820b2e;
      pcVar14 = (char *)local_48->alloc;
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      pFVar12 = pFStack_50;
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00820b33;
        *puVar9 = 0;
      }
      sVar13 = (ulong)argCount * 8;
      obj_00 = (AuxArray<void_*> *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             pcVar14,sVar13 + 8);
      if (obj_00 == (AuxArray<void_*> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        pcVar14 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
        ;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x20d,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00820b33;
        *puVar9 = 0;
      }
      obj_00->count = argCount;
      EmitConstantArgsToVarArray((ByteCodeGenerator *)pcVar14,(Var *)(obj_00 + 1),args,argCount);
      RVar6 = local_38;
      iVar15 = (int)sVar13 + 8;
      if (iVar15 == 0) goto LAB_00820b2e;
      Js::ByteCodeWriter::Auxiliary(this,StArrSegItem_A,local_38,obj_00,iVar15,argCount);
      byteCodeGenerator = local_48;
      Memory::
      DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<void*>>
                (local_48->alloc,obj_00,sVar13);
      RVar4 = extraAlloc;
    }
    if (RVar6 != RVar4) {
      FuncInfo::ReleaseTmpRegister(pFVar12,RVar6);
    }
  }
  pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
  iVar15 = extraAlloc;
  if (pPVar8->spreadCount == 0) {
    return;
  }
  byteCount = (int)uVar17 + 4;
  if (byteCount != 0) {
    Js::ByteCodeWriter::Reg2Aux
              (this,SpreadArrayLiteral,arrayLocation,extraAlloc,local_78,byteCount,(int)uVar17);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<unsigned_int>>
              (byteCodeGenerator->alloc,local_78,uVar17 & 0xffffffff);
    FuncInfo::ReleaseTmpRegister(pFVar12,iVar15);
    return;
  }
LAB_00820b2e:
  Math::DefaultOverflowPolicy();
}

Assistant:

void SetNewArrayElements(ParseNode *pnode, Js::RegSlot arrayLocation, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    ParseNode *args = pnode->AsParseNodeUni()->pnode1;
    uint argCount = pnode->AsParseNodeArrLit()->count;
    uint spreadCount = pnode->AsParseNodeArrLit()->spreadCount;
    bool nativeArrays = CreateNativeArrays(byteCodeGenerator, funcInfo);

    bool arrayIntOpt = nativeArrays && pnode->AsParseNodeArrLit()->arrayOfInts;
    if (arrayIntOpt)
    {
        int extraAlloc = 0, auxSize = 0;
        if (Int32Math::Mul(argCount, sizeof(int32), &extraAlloc)
            || Int32Math::Add(sizeof(Js::AuxArray<int>), extraAlloc, &auxSize))
        {
            ::Math::DefaultOverflowPolicy();
        }
        Js::AuxArray<int> *ints = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<int32>, argCount);
        EmitConstantArgsToIntArray(byteCodeGenerator, ints->elements, args, argCount);
        Assert(!pnode->AsParseNodeArrLit()->hasMissingValues);
        byteCodeGenerator->Writer()->Auxiliary(
            Js::OpCode::NewScIntArray,
            pnode->location,
            ints,
            auxSize,
            argCount);
        AdeletePlus(byteCodeGenerator->GetAllocator(), extraAlloc, ints);
        return;
    }

    bool arrayNumOpt = nativeArrays && pnode->AsParseNodeArrLit()->arrayOfNumbers;
    if (arrayNumOpt)
    {
        int extraAlloc = 0, auxSize = 0;
        if (Int32Math::Mul(argCount, sizeof(double), &extraAlloc)
            || Int32Math::Add(sizeof(Js::AuxArray<double>), extraAlloc, &auxSize))
        {
            ::Math::DefaultOverflowPolicy();
        }
        Js::AuxArray<double> *doubles = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<double>, argCount);
        EmitConstantArgsToFltArray(byteCodeGenerator, doubles->elements, args, argCount);
        Assert(!pnode->AsParseNodeArrLit()->hasMissingValues);
        byteCodeGenerator->Writer()->Auxiliary(
            Js::OpCode::NewScFltArray,
            pnode->location,
            doubles,
            auxSize,
            argCount);
        AdeletePlus(byteCodeGenerator->GetAllocator(), extraAlloc, doubles);
        return;
    }

    bool arrayLitOpt = pnode->AsParseNodeArrLit()->arrayOfTaggedInts && pnode->AsParseNodeArrLit()->count > 1;
    Assert(!arrayLitOpt || !nativeArrays);

    Js::RegSlot spreadArrLoc = arrayLocation;
    Js::AuxArray<uint32> *spreadIndices = nullptr;
    const uint extraAlloc = UInt32Math::Mul(spreadCount, sizeof(uint32));
    if (pnode->AsParseNodeArrLit()->spreadCount > 0)
    {
        arrayLocation = funcInfo->AcquireTmpRegister();
        spreadIndices = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<uint32>, spreadCount);
    }

    byteCodeGenerator->Writer()->Reg1Unsigned1(
        pnode->AsParseNodeArrLit()->hasMissingValues ? Js::OpCode::NewScArrayWithMissingValues : Js::OpCode::NewScArray,
        arrayLocation,
        argCount);

    if (args != nullptr)
    {
        Js::OpCode opcode;
        Js::RegSlot arrLoc;
        if (argCount == 1 && !byteCodeGenerator->Writer()->DoProfileNewScArrayOp(Js::OpCode::NewScArray))
        {
            opcode = Js::OpCode::StArrItemC_CI4;
            arrLoc = arrayLocation;
        }
        else if (arrayLitOpt)
        {
            opcode = Js::OpCode::StArrSegItem_A;
            arrLoc = funcInfo->AcquireTmpRegister();
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdArrHead, arrLoc, arrayLocation);
        }
        else if (Js::JavascriptArray::HasInlineHeadSegment(argCount))
        {
            // The head segment will be allocated inline as an interior pointer. To keep the array alive, the set operation
            // should be done relative to the array header to keep it alive (instead of the array segment).
            opcode = Js::OpCode::StArrInlineItem_CI4;
            arrLoc = arrayLocation;
        }
        else if (argCount <= Js::JavascriptArray::MaxInitialDenseLength)
        {
            opcode = Js::OpCode::StArrSegItem_CI4;
            arrLoc = funcInfo->AcquireTmpRegister();
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdArrHead, arrLoc, arrayLocation);
        }
        else
        {
            opcode = Js::OpCode::StArrItemI_CI4;
            arrLoc = arrayLocation;
        }

        if (arrayLitOpt)
        {
            uint32 allocSize = UInt32Math::Mul(argCount, sizeof(Js::Var));
            Js::VarArray *vars = AnewPlus(byteCodeGenerator->GetAllocator(), allocSize, Js::VarArray, argCount);

            EmitConstantArgsToVarArray(byteCodeGenerator, vars->elements, args, argCount);

            // Generate the opcode with vars
            byteCodeGenerator->Writer()->Auxiliary(Js::OpCode::StArrSegItem_A, arrLoc, vars, UInt32Math::Add(sizeof(Js::VarArray), allocSize), argCount);

            AdeletePlus(byteCodeGenerator->GetAllocator(), allocSize, vars);
        }
        else
        {
            uint i = 0;
            unsigned spreadIndex = 0;
            Js::RegSlot rhsLocation;
            while (args->nop == knopList)
            {
                if (args->AsParseNodeBin()->pnode1->nop != knopEmpty)
                {
                    Emit(args->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
                    rhsLocation = args->AsParseNodeBin()->pnode1->location;
                    Js::RegSlot regVal = rhsLocation;
                    if (args->AsParseNodeBin()->pnode1->nop == knopEllipsis)
                    {
                        AnalysisAssert(spreadIndices);
                        regVal = funcInfo->AcquireTmpRegister();
                        byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdCustomSpreadIteratorList, regVal, rhsLocation);
                        spreadIndices->elements[spreadIndex++] = i;
                    }

                    byteCodeGenerator->Writer()->ElementUnsigned1(opcode, regVal, arrLoc, i);

                    if (args->AsParseNodeBin()->pnode1->nop == knopEllipsis)
                    {
                        funcInfo->ReleaseTmpRegister(regVal);
                    }

                    funcInfo->ReleaseLoc(args->AsParseNodeBin()->pnode1);
                }

                args = args->AsParseNodeBin()->pnode2;
                i++;
            }

            if (args->nop != knopEmpty)
            {
                Emit(args, byteCodeGenerator, funcInfo, false);
                rhsLocation = args->location;
                Js::RegSlot regVal = rhsLocation;
                if (args->nop == knopEllipsis)
                {
                    regVal = funcInfo->AcquireTmpRegister();
                    byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdCustomSpreadIteratorList, regVal, rhsLocation);
                    AnalysisAssert(spreadIndices);
                    spreadIndices->elements[spreadIndex] = i;
                }

                byteCodeGenerator->Writer()->ElementUnsigned1(opcode, regVal, arrLoc, i);

                if (args->nop == knopEllipsis)
                {
                    funcInfo->ReleaseTmpRegister(regVal);
                }

                funcInfo->ReleaseLoc(args);
                i++;
            }
            Assert(i <= argCount);
        }

        if (arrLoc != arrayLocation)
        {
            funcInfo->ReleaseTmpRegister(arrLoc);
        }
    }

    if (pnode->AsParseNodeArrLit()->spreadCount > 0)
    {
        byteCodeGenerator->Writer()->Reg2Aux(Js::OpCode::SpreadArrayLiteral, spreadArrLoc, arrayLocation, spreadIndices, UInt32Math::Add(sizeof(Js::AuxArray<uint32>), extraAlloc), extraAlloc);
        AdeletePlus(byteCodeGenerator->GetAllocator(), extraAlloc, spreadIndices);
        funcInfo->ReleaseTmpRegister(arrayLocation);
    }
}